

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdDotAdd<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  long lVar1;
  Simd<short,_(unsigned_char)__b_> lhs;
  Simd<short,_(unsigned_char)__b_> rhs;
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  Simd<unsigned_int,_(unsigned_char)__x04_> acc;
  undefined8 uStack_50;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  uStack_50 = 0x1bff09;
  local_18.v128_.v = (v128)Pop(this);
  uStack_50 = 0x1bff1b;
  local_38 = (undefined1  [16])Pop(this);
  uStack_50 = 0x1bff2d;
  local_48.v128_.v = (v128)Pop(this);
  lVar1 = 2;
  do {
    *(int *)(local_38 + lVar1 + 0xe) =
         (int)*(short *)(local_38 + lVar1) * (int)*(short *)((long)&local_48 + lVar1) +
         (int)*(short *)((long)&local_48 + lVar1 + 0xe) *
         (int)*(short *)((long)&uStack_50 + lVar1 + 6) + *(int *)(local_28 + lVar1 + 0xe);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x12);
  uStack_50 = 0x1bff7a;
  Push(this,(Value)local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdDotAdd() {
  using SL = typename S::LaneType;
  auto acc = Pop<S>();
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = i * 2;
    SL lo = SL(lhs[laneidx]) * SL(rhs[laneidx]);
    SL hi = SL(lhs[laneidx + 1]) * SL(rhs[laneidx + 1]);
    result[i] = Add(lo, hi);
    result[i] = Add(result[i], acc[i]);
  }
  Push(result);
  return RunResult::Ok;
}